

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O2

bool __thiscall trun::TestRunner::ExecuteMainExit(TestRunner *this)

{
  element_type *dynlib;
  Config *pCVar1;
  ResultSummary *this_00;
  bool bVar2;
  Ref result;
  Ref dummy;
  CBPrePostHook local_98;
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  CBPrePostHook local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  pCVar1 = Config::Instance();
  bVar2 = true;
  if ((pCVar1->testGlobalMain == true) &&
     ((this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0)) {
    gnilk::Log::Info<char_const*>(this->pLogger,"Executing Global Exit");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"_dummy-main_",(allocator<char> *)&local_98);
    TestModule::Create((string *)local_70);
    std::__cxx11::string::~string((string *)local_90);
    std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8),
               (__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)local_70);
    SetCurrentTestModule((Ref *)(local_40 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    dynlib = (this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *)&local_50,
               &(this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>);
    local_98.cbHookV1 = (TRUN_PRE_POST_HOOK_DELEGATE_V1 *)0x0;
    local_40._0_8_ = 0;
    TestFunc::Execute((TestFunc *)local_90,(Ref *)dynlib,&local_50,&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    this_00 = ResultSummary::Instance();
    std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x10),
               &(this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>);
    ResultSummary::AddResult(this_00,(Ref *)(local_70 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x18));
    bVar2 = true;
    if ((*(byte *)(local_90._0_8_ + 0x41) | 2) == 3) {
      pCVar1 = Config::Instance();
      if (pCVar1->stopOnAllFail == true) {
        gnilk::Log::Info<char_const*>(this->pLogger,"Total test failure, aborting");
        bVar2 = false;
      }
    }
    gnilk::Log::Info<char_const*>(this->pLogger,"Done: test main exit\n\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  }
  return bVar2;
}

Assistant:

bool TestRunner::ExecuteMainExit() {

    bool bRes = true;
    if (!Config::Instance().testGlobalMain) {
        return bRes;
    }
    if (globalExit == nullptr) {
        return bRes;
    }

    pLogger->Info("Executing Global Exit");

    // Create dummy module (see: ExecuteMain for expl.)
    auto dummy = TestModule::Create("_dummy-main_");
    SetCurrentTestModule(dummy);

    TestResult::Ref result = globalExit->Execute(library, {}, {});
    ResultSummary::Instance().AddResult(globalExit);

    if ((result->Result() == kTestResult_AllFail) || (result->Result() == kTestResult_TestFail)) {
        if (Config::Instance().stopOnAllFail) {
            pLogger->Info("Total test failure, aborting");
            bRes = false;
        }
    }

    pLogger->Info("Done: test main exit\n\n");
    return bRes;

}